

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.cpp
# Opt level: O0

Group * __thiscall ezc3d::ParametersNS::Parameters::group(Parameters *this,size_t idx)

{
  const_reference pvVar1;
  vector<ezc3d::ParametersNS::GroupNS::Group,_std::allocator<ezc3d::ParametersNS::GroupNS::Group>_>
  *in_RDI;
  out_of_range *anon_var_0;
  size_type in_stack_fffffffffffffef8;
  
  pvVar1 = std::
           vector<ezc3d::ParametersNS::GroupNS::Group,_std::allocator<ezc3d::ParametersNS::GroupNS::Group>_>
           ::at(in_RDI,in_stack_fffffffffffffef8);
  return pvVar1;
}

Assistant:

const ezc3d::ParametersNS::GroupNS::Group &
ezc3d::ParametersNS::Parameters::group(size_t idx) const {
  try {
    return _groups.at(idx);
  } catch (const std::out_of_range&) {
    throw std::out_of_range(
        "Parameters::group method is trying to access the group " +
        std::to_string(idx) + " while the maximum number of groups is " +
        std::to_string(nbGroups()) + ".");
  }
}